

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highs_c_api.cpp
# Opt level: O1

HighsInt Highs_passLinearObjectives
                   (void *highs,HighsInt num_linear_objective,double *weight,double *offset,
                   double *coefficients,double *abs_tolerance,double *rel_tolerance,
                   HighsInt *priority)

{
  HighsStatus HVar1;
  HighsStatus HVar2;
  double *__args;
  long lVar3;
  ulong uVar4;
  void *pvVar5;
  undefined1 local_88 [16];
  double *local_78;
  iterator iStack_70;
  double *local_68;
  double local_60;
  double local_58;
  HighsInt local_50;
  double *local_48;
  ulong local_40;
  double *local_38;
  
  local_48 = coefficients;
  HVar1 = Highs::clearLinearObjectives((Highs *)highs);
  if (HVar1 == kOk) {
    local_78 = (double *)0x0;
    iStack_70._M_current = (double *)0x0;
    local_68 = (double *)0x0;
    if (0 < num_linear_objective) {
      local_40 = (ulong)(uint)num_linear_objective;
      uVar4 = 0;
      pvVar5 = highs;
      local_38 = offset;
      do {
        lVar3 = (long)*(int *)((long)highs + 0x138);
        local_88._0_8_ = weight[uVar4];
        local_88._8_8_ = local_38[uVar4];
        if (0 < lVar3) {
          __args = local_48 + *(int *)((long)highs + 0x138) * (HighsInt)uVar4;
          do {
            if (iStack_70._M_current == local_68) {
              std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                        ((vector<double,std::allocator<double>> *)&local_78,iStack_70,__args);
            }
            else {
              *iStack_70._M_current = *__args;
              iStack_70._M_current = iStack_70._M_current + 1;
            }
            __args = __args + 1;
            lVar3 = lVar3 + -1;
          } while (lVar3 != 0);
        }
        local_60 = abs_tolerance[uVar4];
        local_58 = rel_tolerance[uVar4];
        local_50 = priority[uVar4];
        local_88._0_8_ = weight[uVar4];
        HVar2 = Highs::addLinearObjective
                          ((Highs *)highs,(HighsLinearObjective *)local_88,(HighsInt)uVar4);
        HVar1 = HVar2;
        if (HVar2 == kOk) {
          if (iStack_70._M_current != local_78) {
            iStack_70._M_current = local_78;
          }
          HVar1 = (HighsStatus)pvVar5;
        }
        if (HVar2 != kOk) goto LAB_001e79c4;
        uVar4 = uVar4 + 1;
        pvVar5 = (void *)(ulong)(uint)HVar1;
      } while (uVar4 != local_40);
    }
    HVar1 = kOk;
LAB_001e79c4:
    if (local_78 != (double *)0x0) {
      operator_delete(local_78);
    }
  }
  return HVar1;
}

Assistant:

HighsInt Highs_passLinearObjectives(const void* highs,
                                    const HighsInt num_linear_objective,
                                    const double* weight, const double* offset,
                                    const double* coefficients,
                                    const double* abs_tolerance,
                                    const double* rel_tolerance,
                                    const HighsInt* priority) {
  HighsInt status = Highs_clearLinearObjectives(highs);
  if (status != kHighsStatusOk) return status;
  HighsLinearObjective linear_objective;
  for (HighsInt iObj = 0; iObj < num_linear_objective; iObj++) {
    HighsInt num_col = Highs_getNumCol(highs);
    linear_objective.weight = weight[iObj];
    linear_objective.offset = offset[iObj];
    for (HighsInt iCol = 0; iCol < num_col; iCol++)
      linear_objective.coefficients.push_back(
          coefficients[iObj * num_col + iCol]);
    linear_objective.abs_tolerance = abs_tolerance[iObj];
    linear_objective.rel_tolerance = rel_tolerance[iObj];
    linear_objective.priority = priority[iObj];
    linear_objective.weight = weight[iObj];
    status =
        HighsInt(((Highs*)highs)->addLinearObjective(linear_objective, iObj));
    if (status != kHighsStatusOk) return status;
    linear_objective.coefficients.clear();
  }
  return kHighsStatusOk;
}